

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_201151b::OriginPubkeyProvider::ToNormalizedString
          (OriginPubkeyProvider *this,SigningProvider *arg,string *ret,DescriptorCache *cache)

{
  long lVar1;
  PubkeyProvider *pPVar2;
  int iVar3;
  string *this_00;
  long in_FS_OFFSET;
  string sStack_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string sub;
  
  this_00 = &sStack_c8;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sub._M_dataplus._M_p = (pointer)&sub.field_2;
  sub._M_string_length = 0;
  sub.field_2._M_local_buf[0] = '\0';
  pPVar2 = (this->m_provider)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
  iVar3 = (*pPVar2->_vptr_PubkeyProvider[7])(pPVar2,arg,&sub);
  if (SUB41(iVar3,0) != false) {
    if (*sub._M_dataplus._M_p == '[') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_68,&sub,9,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&sub,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      (anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
                (&local_a8,this,PUBLIC,true);
      std::operator+(&local_88,"[",&local_a8);
      std::operator+(&local_68,&local_88,&sub);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (ret,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      this_00 = &local_a8;
    }
    else {
      (anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
                (&sStack_c8,this,PUBLIC,true);
      std::operator+(&local_a8,"[",&sStack_c8);
      std::operator+(&local_88,&local_a8,"]");
      std::operator+(&local_68,&local_88,&sub);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (ret,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::string::~string((string *)&sub);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(iVar3,0);
  }
  __stack_chk_fail();
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& ret, const DescriptorCache* cache) const override
    {
        std::string sub;
        if (!m_provider->ToNormalizedString(arg, sub, cache)) return false;
        // If m_provider is a BIP32PubkeyProvider, we may get a string formatted like a OriginPubkeyProvider
        // In that case, we need to strip out the leading square bracket and fingerprint from the substring,
        // and append that to our own origin string.
        if (sub[0] == '[') {
            sub = sub.substr(9);
            ret = "[" + OriginString(StringType::PUBLIC, /*normalized=*/true) + std::move(sub);
        } else {
            ret = "[" + OriginString(StringType::PUBLIC, /*normalized=*/true) + "]" + std::move(sub);
        }
        return true;
    }